

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void kj::anon_unknown_36::requireValidHeaderValue(StringPtr value)

{
  size_t sVar1;
  _ *this;
  long lVar2;
  undefined1 in_R8B;
  ArrayPtr<const_unsigned_char> bytes;
  DebugExpression<bool> _kjCondition;
  Fault f;
  String local_20;
  
  sVar1 = value.content.size_;
  this = (_ *)value.content.ptr;
  _kjCondition.value = this + (sVar1 - 1) == this;
  if (!_kjCondition.value) {
    lVar2 = 0;
    in_R8B = true;
    do {
      if (((byte)this[lVar2] < 0xe) && ((0x2401U >> ((byte)this[lVar2] & 0x1f) & 1) != 0)) break;
      lVar2 = lVar2 + 1;
      _kjCondition.value = sVar1 - 1 == lVar2;
    } while (!_kjCondition.value);
  }
  if (_kjCondition.value) {
    return;
  }
  bytes.ptr = sVar1 - 1;
  bytes.size_ = 0;
  kj::_::encodeCEscapeImpl(&local_20,this,bytes,(bool)in_R8B);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21],kj::String>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f6,FAILED,"HttpHeaders::isValidHeaderValue(value)",
             "_kjCondition,\"invalid header value\", kj::encodeCEscape(value)",&_kjCondition,
             (char (*) [21])"invalid header value",&local_20);
  String::~String(&local_20);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static void requireValidHeaderValue(kj::StringPtr value) {
  KJ_REQUIRE(HttpHeaders::isValidHeaderValue(value), "invalid header value",
      kj::encodeCEscape(value));
}